

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::beta_dist<float>::pdf(beta_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  int *piVar2;
  result_type_conflict1 rVar3;
  float fVar4;
  float fVar5;
  
  rVar3 = 0.0;
  if ((0.0 <= x) && (x <= 1.0)) {
    if (((x == 0.0) && ((!NAN(x) && ((this->P).alpha_ + -1.0 < 0.0)))) ||
       ((x == 1.0 && ((!NAN(x) && ((this->P).beta_ + -1.0 < 0.0)))))) {
      piVar2 = __errno_location();
      *piVar2 = 0x21;
      rVar3 = NAN;
    }
    else {
      fVar1 = (this->P).norm_;
      fVar4 = powf(x,(this->P).alpha_ + -1.0);
      fVar5 = powf(1.0 - x,(this->P).beta_ + -1.0);
      rVar3 = fVar5 * fVar4 * (1.0 / fVar1);
    }
  }
  return rVar3;
}

Assistant:

pdf(result_type x) const {
      if (x < 0 or x > 1)
        return 0;
      if ((x == 0 and P.alpha() - 1 < 0) or (x == 1 and P.beta() - 1 < 0)) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return 1 / P.norm() * math::pow(x, P.alpha() - 1) * math::pow(1 - x, P.beta() - 1);
    }